

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O1

void rd_pick_4partition(AV1_COMP *cpi,ThreadData *td,TileDataEnc *tile_data,TokenExtra **tp,
                       MACROBLOCK *x,RD_SEARCH_MACROBLOCK_CONTEXT *x_ctx,PC_TREE *pc_tree,
                       PICK_MODE_CONTEXT **cur_part_ctx,PartitionSearchState *part_search_state,
                       RD_STATS *best_rdc,int *inc_step,PARTITION_TYPE partition_type)

{
  RD_STATS *sum_rdc;
  BLOCK_SIZE bsize;
  int mi_row;
  int mi_col;
  int iVar1;
  uint uVar2;
  int64_t iVar3;
  int64_t iVar4;
  undefined7 uVar5;
  BLOCK_SIZE bsize_00;
  int iVar6;
  PICK_MODE_CONTEXT *pPVar7;
  ulong uVar8;
  ulong uVar9;
  PART4_TYPES i;
  long lVar10;
  int iVar11;
  ulong uVar12;
  BLOCK_SIZE subsize;
  int iVar13;
  bool bVar14;
  int mi_pos [4] [2];
  undefined8 local_60;
  int aiStack_58 [10];
  
  mi_row = (part_search_state->part_blk_params).mi_row;
  mi_col = (part_search_state->part_blk_params).mi_col;
  bsize = (part_search_state->part_blk_params).bsize;
  uVar8 = (ulong)bsize;
  local_60._0_4_ = (cpi->common).mi_params.mi_rows;
  local_60._4_4_ = (cpi->common).mi_params.mi_cols;
  bsize_00 = BLOCK_INVALID;
  subsize = BLOCK_INVALID;
  uVar12 = (ulong)partition_type;
  if (partition_type == 0xff) goto LAB_001f6e5b;
  switch(uVar8) {
  case 0:
    bVar14 = false;
    uVar9 = uVar8;
    goto LAB_001f6e3e;
  case 1:
  case 2:
  case 4:
  case 5:
  case 7:
  case 8:
switchD_001f6dfc_caseD_1:
    bVar14 = true;
    uVar9 = 6;
    goto LAB_001f6e3e;
  case 3:
    uVar9 = 1;
    break;
  case 6:
    uVar9 = 2;
    break;
  case 9:
    uVar9 = 3;
    break;
  default:
    if (bsize == BLOCK_64X64) {
      uVar9 = 4;
    }
    else {
      if (bsize != BLOCK_128X128) goto switchD_001f6dfc_caseD_1;
      uVar9 = 5;
    }
  }
  bVar14 = false;
LAB_001f6e3e:
  if (!bVar14) {
    subsize = subsize_lookup[uVar12][uVar9];
  }
LAB_001f6e5b:
  (part_search_state->sum_rdc).rate = 0;
  (part_search_state->sum_rdc).zero_rate = 0;
  (part_search_state->sum_rdc).dist = 0;
  (part_search_state->sum_rdc).rdcost = 0;
  (part_search_state->sum_rdc).sse = 0;
  (part_search_state->sum_rdc).skip_txfm = '\x01';
  if (partition_type == 0xff) goto LAB_001f6f06;
  switch(uVar8) {
  case 0:
    break;
  case 1:
  case 2:
  case 4:
  case 5:
  case 7:
  case 8:
switchD_001f6eb1_caseD_1:
    uVar8 = 6;
    bVar14 = true;
    goto LAB_001f6eeb;
  case 3:
    uVar8 = 1;
    break;
  case 6:
    uVar8 = 2;
    break;
  case 9:
    uVar8 = 3;
    break;
  default:
    if (bsize == BLOCK_64X64) {
      uVar8 = 4;
    }
    else {
      if (bsize != BLOCK_128X128) goto switchD_001f6eb1_caseD_1;
      uVar8 = 5;
    }
  }
  bVar14 = false;
LAB_001f6eeb:
  if (!bVar14) {
    bsize_00 = subsize_lookup[uVar12][uVar8];
  }
LAB_001f6f06:
  sum_rdc = &part_search_state->sum_rdc;
  iVar6 = part_search_state->partition_cost[uVar12];
  (part_search_state->sum_rdc).rate = iVar6;
  (part_search_state->sum_rdc).rdcost = (long)x->rdmult * (long)iVar6 + 0x100 >> 9;
  lVar10 = 0;
  do {
    pPVar7 = av1_alloc_pmc(cpi,bsize_00,&td->shared_coeff_buf);
    cur_part_ctx[lVar10] = pPVar7;
    if (pPVar7 == (PICK_MODE_CONTEXT *)0x0) {
      aom_internal_error((x->e_mbd).error_info,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PICK_MODE_CONTEXT");
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  iVar6 = *inc_step;
  iVar1 = inc_step[1];
  lVar10 = 0;
  iVar11 = mi_row;
  iVar13 = mi_col;
  do {
    aiStack_58[lVar10 * 2] = iVar11;
    aiStack_58[lVar10 * 2 + 1] = iVar13;
    lVar10 = lVar10 + 1;
    iVar13 = iVar13 + iVar1;
    iVar11 = iVar11 + iVar6;
  } while (lVar10 != 4);
  lVar10 = 0;
  while( true ) {
    if ((lVar10 != 0) &&
       (*(int *)((long)&local_60 + (ulong)(partition_type != '\b') * 4) <=
        *(int *)((long)aiStack_58 + lVar10 + (ulong)(partition_type != '\b') * 4)))
    goto LAB_001f70fb;
    pPVar7 = *(PICK_MODE_CONTEXT **)((long)cur_part_ctx + lVar10);
    pPVar7->rd_mode_is_ready = 0;
    iVar6 = rd_try_subblock(cpi,td,tile_data,tp,(uint)(lVar10 == 0x18),
                            *(int *)((long)aiStack_58 + lVar10),
                            *(int *)((long)aiStack_58 + lVar10 + 4),subsize,*best_rdc,sum_rdc,
                            partition_type,pPVar7);
    if (iVar6 == 0) break;
    lVar10 = lVar10 + 8;
    if (lVar10 == 0x20) {
LAB_001f70fb:
      uVar2 = sum_rdc->rate;
      if ((((ulong)uVar2 == 0x7fffffff) ||
          (lVar10 = (part_search_state->sum_rdc).dist, lVar10 == 0x7fffffffffffffff)) ||
         ((part_search_state->sum_rdc).rdcost == 0x7fffffffffffffff)) {
        (part_search_state->sum_rdc).rate = 0x7fffffff;
        (part_search_state->sum_rdc).zero_rate = 0;
        (part_search_state->sum_rdc).dist = 0x7fffffffffffffff;
        (part_search_state->sum_rdc).rdcost = 0x7fffffffffffffff;
        (part_search_state->sum_rdc).sse = 0x7fffffffffffffff;
        (part_search_state->sum_rdc).skip_txfm = '\0';
      }
      else {
        if ((int)uVar2 < 0) {
          lVar10 = lVar10 * 0x80 - ((long)((ulong)-uVar2 * (long)x->rdmult + 0x100) >> 9);
        }
        else {
          lVar10 = lVar10 * 0x80 + ((long)((ulong)uVar2 * (long)x->rdmult + 0x100) >> 9);
        }
        (part_search_state->sum_rdc).rdcost = lVar10;
      }
      if ((part_search_state->sum_rdc).rdcost < best_rdc->rdcost) {
        uVar5 = *(undefined7 *)&(part_search_state->sum_rdc).field_0x21;
        best_rdc->skip_txfm = (part_search_state->sum_rdc).skip_txfm;
        *(undefined7 *)&best_rdc->field_0x21 = uVar5;
        iVar6 = sum_rdc->rate;
        iVar1 = sum_rdc->zero_rate;
        iVar3 = (part_search_state->sum_rdc).dist;
        iVar4 = (part_search_state->sum_rdc).sse;
        best_rdc->rdcost = (part_search_state->sum_rdc).rdcost;
        best_rdc->sse = iVar4;
        best_rdc->rate = iVar6;
        best_rdc->zero_rate = iVar1;
        best_rdc->dist = iVar3;
        part_search_state->found_best_partition = true;
        pc_tree->partitioning = partition_type;
      }
      bVar14 = ((cpi->common).seq_params)->monochrome == '\0';
      av1_restore_context(x,x_ctx,mi_row,mi_col,bsize,bVar14 + 1 + (uint)bVar14);
      return;
    }
  }
  (part_search_state->sum_rdc).rate = 0x7fffffff;
  (part_search_state->sum_rdc).zero_rate = 0;
  (part_search_state->sum_rdc).dist = 0x7fffffffffffffff;
  (part_search_state->sum_rdc).rdcost = 0x7fffffffffffffff;
  (part_search_state->sum_rdc).sse = 0x7fffffffffffffff;
  (part_search_state->sum_rdc).skip_txfm = '\0';
  goto LAB_001f70fb;
}

Assistant:

static void rd_pick_4partition(
    AV1_COMP *const cpi, ThreadData *td, TileDataEnc *tile_data,
    TokenExtra **tp, MACROBLOCK *x, RD_SEARCH_MACROBLOCK_CONTEXT *x_ctx,
    PC_TREE *pc_tree, PICK_MODE_CONTEXT *cur_part_ctx[SUB_PARTITIONS_PART4],
    PartitionSearchState *part_search_state, RD_STATS *best_rdc,
    const int inc_step[NUM_PART4_TYPES], PARTITION_TYPE partition_type) {
  const AV1_COMMON *const cm = &cpi->common;
  PartitionBlkParams blk_params = part_search_state->part_blk_params;
  // mi positions needed for HORZ4 and VERT4 partition types.
  int mi_pos_check[NUM_PART4_TYPES] = { cm->mi_params.mi_rows,
                                        cm->mi_params.mi_cols };
  const PART4_TYPES part4_idx = (partition_type != PARTITION_HORZ_4);
  int mi_pos[SUB_PARTITIONS_PART4][2];

  blk_params.subsize = get_partition_subsize(blk_params.bsize, partition_type);
  // Set partition context and RD cost.
  set_4_part_ctx_and_rdcost(x, cpi, td, cur_part_ctx, part_search_state,
                            partition_type, blk_params.bsize);
  // Set mi positions for sub-block sizes.
  set_mi_pos_partition4(inc_step, mi_pos, blk_params.mi_row, blk_params.mi_col);
#if CONFIG_COLLECT_PARTITION_STATS
  PartitionTimingStats *part_timing_stats =
      &part_search_state->part_timing_stats;
  if (best_rdc->rdcost - part_search_state->sum_rdc.rdcost >= 0) {
    start_partition_block_timer(part_timing_stats, partition_type);
  }
#endif
  // Loop over sub-block partitions.
  for (PART4_TYPES i = 0; i < SUB_PARTITIONS_PART4; ++i) {
    if (i > 0 && mi_pos[i][part4_idx] >= mi_pos_check[part4_idx]) break;

    // Sub-block evaluation of Horz4 / Vert4 partition type.
    cur_part_ctx[i]->rd_mode_is_ready = 0;
    if (!rd_try_subblock(
            cpi, td, tile_data, tp, (i == SUB_PARTITIONS_PART4 - 1),
            mi_pos[i][0], mi_pos[i][1], blk_params.subsize, *best_rdc,
            &part_search_state->sum_rdc, partition_type, cur_part_ctx[i])) {
      av1_invalid_rd_stats(&part_search_state->sum_rdc);
      break;
    }
  }

  // Calculate the total cost and update the best partition.
  av1_rd_cost_update(x->rdmult, &part_search_state->sum_rdc);
  if (part_search_state->sum_rdc.rdcost < best_rdc->rdcost) {
    *best_rdc = part_search_state->sum_rdc;
    part_search_state->found_best_partition = true;
    pc_tree->partitioning = partition_type;
  }
#if CONFIG_COLLECT_PARTITION_STATS
  if (part_timing_stats->timer_is_on) {
    end_partition_block_timer(part_timing_stats, partition_type,
                              part_search_state->sum_rdc.rdcost);
  }
#endif
  av1_restore_context(x, x_ctx, blk_params.mi_row, blk_params.mi_col,
                      blk_params.bsize, av1_num_planes(cm));
}